

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawImage.cpp
# Opt level: O0

void drawImage2(Array2D<half> *gpx,Array2D<float> *zpx,int w,int h)

{
  float fVar1;
  float *pfVar2;
  int in_ECX;
  int in_EDX;
  Array2D<float> *in_RSI;
  Array2D<half> *in_RDI;
  float in_stack_0000000c;
  float in_stack_00000010;
  float in_stack_00000014;
  float gn;
  float rd;
  float zp;
  float yp;
  float xp;
  float t;
  int i;
  int n;
  int x;
  int y;
  undefined8 in_stack_ffffffffffffffa8;
  half *in_stack_ffffffffffffffb0;
  int local_28;
  int local_20;
  int local_1c;
  
  for (local_1c = 0; local_1c < in_ECX; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < in_EDX; local_20 = local_20 + 1) {
      Imf_2_5::Array2D<half>::operator[](in_RDI,(long)local_1c);
      half::operator=(in_stack_ffffffffffffffb0,(float)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
      pfVar2 = Imf_2_5::Array2D<float>::operator[](in_RSI,(long)local_1c);
      pfVar2[local_20] = 3.4028235e+38;
    }
  }
  for (local_28 = 0; local_28 < 2000; local_28 = local_28 + 1) {
    fVar1 = ((float)local_28 * 2.0 * 3.1415927) / 2000.0;
    sin((double)fVar1 * 4.0);
    sin((double)fVar1 * 15.0);
    cos((double)fVar1 * 3.0);
    cos((double)fVar1 * 15.0);
    sin((double)fVar1 * 5.0);
    sin((double)fVar1 * 15.0);
    anon_unknown.dwarf_10b1::zsp
              (_i,_xp,(int)yp,(int)zp,rd,gn,in_stack_00000014,in_stack_00000010,in_stack_0000000c);
  }
  return;
}

Assistant:

void
drawImage2 (Array2D<half> &gpx, Array2D<float> &zpx, int w, int h)
{
    for (int y = 0; y < h; ++y)
    {
	for (int x = 0; x < w; ++x)
	{
	    gpx[y][x] = 0;
	    zpx[y][x] = FLT_MAX;
	}
    }

    int n = 2000;

    for (int i = 0; i < n; ++i)
    {
	float t = (i * 2.0 * M_PI) / n;
	float xp = sin (t * 4.0) + 0.2 * sin (t * 15.0);
	float yp = cos (t * 3.0) + 0.2 * cos (t * 15.0);
	float zp = sin (t * 5.0);
	float rd = 0.7 + 0.3 * sin (t * 15.0);
	float gn = 0.5 - 0.5 * zp + 0.2;

	zsp (gpx, zpx, w, h,
	     xp * w / 3 + w / 2,
	     yp * h / 3 + h / 2,
	     zp * w + 3 * w,
	     w * rd * 0.05,
	     2.5 * gn * gn);
    }
}